

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  string prefix_input;
  string _dbg_option;
  xcard xc;
  undefined1 *local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  xcard local_58;
  
  local_d8 = local_c8;
  local_d0 = 0;
  local_c8[0] = 0;
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Prefix (Upto 15 digits): ",0x1f);
  std::operator>>((istream *)&std::cin,(string *)&local_d8);
  if (local_d0 < 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enable Debug Messages [Y/N]: ",0x1d);
    std::operator>>((istream *)&std::cin,(string *)&local_b8);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_d8,local_d8 + local_d0);
    iVar1 = std::__cxx11::string::compare((char *)&local_b8);
    xcard::xcard(&local_58,&local_78,(uint)(iVar1 == 0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    poVar2 = std::ostream::_M_insert<double>((double)local_58.VERSION);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar3 = 10;
    do {
      xcard::generateCard_abi_cxx11_(&local_98,&local_58);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.prefix._M_dataplus._M_p != &local_58.prefix.field_2) {
      operator_delete(local_58.prefix._M_dataplus._M_p);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
    return 0;
  }
  __assert_fail("prefix_input.length() < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jkotra[P]xcard/src/demo.cpp"
                ,0xe,"int main()");
}

Assistant:

int main()
{

    std::string prefix_input;
    std::string _dbg_option;

    std::cout << "Enter Prefix (Upto 15 digits): ";
    std::cin >> prefix_input;
    assert(prefix_input.length() < 16);
    
    std::cout << "Enable Debug Messages [Y/N]: ";
    std::cin >> _dbg_option;

    xcard xc(prefix_input, _dbg_option == "Y" ? true : false);
    std::cout << xc.VERSION << std::endl;

    for (size_t i = 0; i < 10; i++)
    {
        std::cout << xc.generateCard() << std::endl; 
    }

    return 0;
}